

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausWriteIndClauses(Clu_Man_t *p)

{
  int iVar1;
  int *pVar2Id_00;
  Aig_Man_t *p_00;
  int *piVar2;
  Aig_Obj_t *p1;
  char *pFileName;
  int local_50;
  int local_4c;
  int k;
  int i;
  int End;
  int Beg;
  int *pVar2Id;
  int *pStart;
  char *pName;
  Aig_Obj_t *pLiteral;
  Aig_Obj_t *pClause;
  Aig_Man_t *pNew;
  Clu_Man_t *p_local;
  
  pVar2Id_00 = (int *)malloc((long)p->pCnf->nVars << 2);
  memset(pVar2Id_00,0xff,(long)p->pCnf->nVars << 2);
  local_4c = 0;
  do {
    iVar1 = Aig_ManObjNumMax(p->pAig);
    if (iVar1 <= local_4c) {
      p_00 = Aig_ManDupWithoutPos(p->pAig);
      i = 0;
      piVar2 = Vec_IntArray(p->vLitsProven);
      for (local_4c = 0; iVar1 = Vec_IntSize(p->vClausesProven), local_4c < iVar1;
          local_4c = local_4c + 1) {
        iVar1 = Vec_IntEntry(p->vClausesProven,local_4c);
        pLiteral = Fra_ClausGetLiteral(p,pVar2Id_00,piVar2[i]);
        while (local_50 = i + 1, local_50 < iVar1) {
          p1 = Fra_ClausGetLiteral(p,pVar2Id_00,piVar2[local_50]);
          pLiteral = Aig_Or(p_00,pLiteral,p1);
          i = local_50;
        }
        Aig_ObjCreateCo(p_00,pLiteral);
        i = iVar1;
      }
      if (pVar2Id_00 != (int *)0x0) {
        free(pVar2Id_00);
      }
      Aig_ManCleanup(p_00);
      pFileName = Ioa_FileNameGenericAppend(p->pAig->pName,"_care.aig");
      printf("Care one-hotness clauses will be written into file \"%s\".\n",pFileName);
      Ioa_WriteAiger(p_00,pFileName,0,1);
      Aig_ManStop(p_00);
      return;
    }
    if (-1 < p->pCnf->pVarNums[local_4c]) {
      if (p->pCnf->nVars <= p->pCnf->pVarNums[local_4c]) {
        __assert_fail("p->pCnf->pVarNums[i] < p->pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                      ,0x612,"void Fra_ClausWriteIndClauses(Clu_Man_t *)");
      }
      pVar2Id_00[p->pCnf->pVarNums[local_4c]] = local_4c;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void Fra_ClausWriteIndClauses( Clu_Man_t * p )
{ 
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
    Aig_Man_t * pNew;
    Aig_Obj_t * pClause, * pLiteral;
    char * pName;
    int * pStart, * pVar2Id; 
    int Beg, End, i, k;
    // create mapping from SAT vars to node IDs
    pVar2Id = ABC_ALLOC( int, p->pCnf->nVars );
    memset( pVar2Id, 0xFF, sizeof(int) * p->pCnf->nVars );
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        if ( p->pCnf->pVarNums[i] >= 0 )
        {
            assert( p->pCnf->pVarNums[i] < p->pCnf->nVars );
            pVar2Id[ p->pCnf->pVarNums[i] ] = i;
        }
    // start the manager
    pNew = Aig_ManDupWithoutPos( p->pAig );
    // add the clauses
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        pClause = Fra_ClausGetLiteral( p, pVar2Id, pStart[Beg] );
        for ( k = Beg + 1; k < End; k++ )
        {
            pLiteral = Fra_ClausGetLiteral( p, pVar2Id, pStart[k] );
            pClause = Aig_Or( pNew, pClause, pLiteral );
        }
        Aig_ObjCreateCo( pNew, pClause );
        Beg = End;
    }
    ABC_FREE( pVar2Id );
    Aig_ManCleanup( pNew );
    pName = Ioa_FileNameGenericAppend( p->pAig->pName, "_care.aig" );
    printf( "Care one-hotness clauses will be written into file \"%s\".\n", pName );
    Ioa_WriteAiger( pNew, pName, 0, 1 );
    Aig_ManStop( pNew );
}